

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O3

QLineF * QLineF::fromPolar(QLineF *__return_storage_ptr__,qreal length,qreal angle)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos(angle * 0.017453292519943295);
  dVar2 = sin(angle * 0.017453292519943295);
  (__return_storage_ptr__->pt1).xp = 0.0;
  (__return_storage_ptr__->pt1).yp = 0.0;
  (__return_storage_ptr__->pt2).xp = length * dVar1;
  (__return_storage_ptr__->pt2).yp = length * -dVar2;
  return __return_storage_ptr__;
}

Assistant:

QLineF QLineF::fromPolar(qreal length, qreal angle)
{
    const qreal angleR = qDegreesToRadians(angle);
    return QLineF(0, 0, qCos(angleR) * length, -qSin(angleR) * length);
}